

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

cb_class CB_ADF::get_observed_cost(multi_ex *examples)

{
  undefined4 uVar1;
  undefined4 uVar2;
  example *peVar3;
  undefined4 uVar4;
  cb_class cVar5;
  bool bVar6;
  iterator __lhs;
  size_t sVar7;
  cb_class *pcVar8;
  undefined8 in_RDI;
  example **ec;
  iterator __end1;
  iterator __begin1;
  multi_ex *__range1;
  size_t i;
  int index;
  label ld;
  cb_class known_cost;
  vector<example_*,_std::allocator<example_*>_> *in_stack_ffffffffffffff78;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_78;
  undefined8 local_70;
  long local_68;
  int local_5c;
  label_t local_58;
  cb_class *local_50;
  cb_class *local_48;
  size_t local_40;
  v_array<CB::cb_class> local_38;
  undefined8 local_18;
  undefined4 local_10;
  int iStack_c;
  undefined4 local_8;
  float fStack_4;
  
  local_18 = in_RDI;
  v_init<CB::cb_class>();
  local_38._begin = (cb_class *)local_58;
  local_38._end = local_50;
  local_38.end_array = local_48;
  local_38.erase_count = local_40;
  local_5c = -1;
  local_68 = 0;
  local_70 = local_18;
  local_78._M_current =
       (example **)
       std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_ffffffffffffff78);
  __lhs = std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_ffffffffffffff78);
  while (bVar6 = __gnu_cxx::operator!=
                           ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                             *)in_stack_ffffffffffffff78), bVar6) {
    in_stack_ffffffffffffff78 =
         (vector<example_*,_std::allocator<example_*>_> *)
         __gnu_cxx::
         __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
         operator*(&local_78);
    sVar7 = v_array<CB::cb_class>::size
                      ((v_array<CB::cb_class> *)
                       &(((example *)
                         (in_stack_ffffffffffffff78->
                         super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                         super__Vector_impl_data._M_start)->l).simple);
    if (sVar7 == 1) {
      pcVar8 = v_array<CB::cb_class>::operator[]
                         ((v_array<CB::cb_class> *)
                          &(((example *)
                            (in_stack_ffffffffffffff78->
                            super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_start)->l).simple,0);
      if (((pcVar8->cost != 3.4028235e+38) || (NAN(pcVar8->cost))) &&
         (pcVar8 = v_array<CB::cb_class>::operator[]
                             ((v_array<CB::cb_class> *)
                              &(((example *)
                                (in_stack_ffffffffffffff78->
                                super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                                super__Vector_impl_data._M_start)->l).simple,0),
         0.0 < pcVar8->probability)) {
        peVar3 = (example *)
                 (in_stack_ffffffffffffff78->
                 super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_38._begin = *(cb_class **)&(peVar3->l).multi;
        local_38._end = (cb_class *)(peVar3->l).cs.costs._end;
        local_38.end_array = (cb_class *)(peVar3->l).cs.costs.end_array;
        local_38.erase_count = (peVar3->l).cs.costs.erase_count;
        local_5c = (int)local_68;
      }
    }
    local_68 = local_68 + 1;
    __gnu_cxx::__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
    operator++(&local_78);
  }
  if (local_5c == -1) {
    local_8 = 0xbf800000;
  }
  else {
    pcVar8 = v_array<CB::cb_class>::operator[](&local_38,0);
    uVar1 = pcVar8->cost;
    uVar2 = pcVar8->probability;
    uVar4 = pcVar8->partial_prediction;
    iStack_c = local_5c;
    local_10 = uVar1;
    local_8 = uVar2;
    fStack_4 = (float)uVar4;
  }
  cVar5.action = iStack_c;
  cVar5.cost = (float)local_10;
  cVar5.probability = (float)local_8;
  cVar5.partial_prediction = fStack_4;
  return cVar5;
}

Assistant:

CB::cb_class get_observed_cost(multi_ex& examples)
{
  CB::label ld;
  ld.costs = v_init<cb_class>();
  int index = -1;
  CB::cb_class known_cost;

  size_t i = 0;
  for (example*& ec : examples)
  {
    if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
    {
      ld = ec->l.cb;
      index = (int)i;
    }
    ++i;
  }

  // handle -1 case.
  if (index == -1)
  {
    known_cost.probability = -1;
    return known_cost;
    // std::cerr << "None of the examples has known cost. Exiting." << endl;
    // throw exception();
  }

  known_cost = ld.costs[0];
  known_cost.action = index;
  return known_cost;
}